

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O3

void __thiscall FConfigFile::FConfigFile(FConfigFile *this)

{
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_0086c700;
  (this->PathName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  this->CurrentSection = (FConfigSection *)0x0;
  this->CurrentEntry = (FConfigEntry *)0x0;
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  FString::operator=(&this->PathName,(char *)"");
  this->OkayToWrite = true;
  this->FileExisted = true;
  return;
}

Assistant:

FConfigFile::FConfigFile ()
{
	Sections = CurrentSection = NULL;
	LastSectionPtr = &Sections;
	CurrentEntry = NULL;
	PathName = "";
	OkayToWrite = true;
	FileExisted = true;
}